

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void small_mempool_create_groups(small_alloc *alloc,small_mempool *first,small_mempool *last)

{
  uint uVar1;
  byte bVar2;
  uint i;
  uint uVar3;
  intptr_t iVar4;
  ulong uVar5;
  uint uVar6;
  small_mempool *last_in_group;
  small_mempool *small_mempool;
  
  do {
    if (last < first) {
      return;
    }
    small_mempool = first;
    for (bVar2 = 0; (small_mempool < last && (bVar2 < 0x1f)); bVar2 = bVar2 + 1) {
      small_mempool = small_mempool + 1;
    }
    uVar1 = alloc->small_mempool_groups_size;
    alloc->small_mempool_groups[uVar1].first = first;
    alloc->small_mempool_groups[uVar1].last = small_mempool;
    alloc->small_mempool_groups[uVar1].active_pool_mask = 0;
    iVar4 = slab_order_size((small_mempool->pool).cache,(small_mempool->pool).slab_order);
    alloc->small_mempool_groups[uVar1].waste_max = iVar4 / 4;
    for (; first <= small_mempool; first = first + 1) {
      first->group = alloc->small_mempool_groups + uVar1;
      if (first->appropriate_pool_mask != 0) {
        __assert_fail("small_mempool->appropriate_pool_mask == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                      ,0xa5,"void small_mempool_set_mask(struct small_mempool *)");
      }
      uVar6 = 0;
      uVar5 = ((long)first - (long)alloc->small_mempool_groups[uVar1].first) / 0x98;
      while (uVar3 = (uint)uVar5, uVar3 < 0x20) {
        uVar6 = uVar6 | 1 << (uVar3 & 0x1f);
        first->appropriate_pool_mask = uVar6;
        uVar5 = (ulong)(uVar3 + 1);
      }
    }
    alloc->small_mempool_groups_size = alloc->small_mempool_groups_size + 1;
    small_mempool_activate(small_mempool);
    first = small_mempool + 1;
  } while( true );
}

Assistant:

static inline void
small_mempool_create_groups(struct small_alloc *alloc,
			    struct small_mempool *first,
			    struct small_mempool *last)
{
	struct small_mempool *first_in_group = first;
	while (first_in_group <= last) {
		struct small_mempool *last_in_group =
			small_mempool_group_last_pool(first_in_group, last);
		small_mempool_create_group(alloc, first_in_group,
					   last_in_group);
		first_in_group = last_in_group + 1;
	}
}